

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_string_field.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::InlinedStringField::Release_abi_cxx11_
          (InlinedStringField *this,Arena *arena,bool donated)

{
  string *psVar1;
  undefined8 local_78;
  string *released;
  bool donated_local;
  Arena *arena_local;
  InlinedStringField *this_local;
  
  if ((arena == (Arena *)0x0) || (!donated)) {
    local_78 = (string *)operator_new(0x20);
    psVar1 = get_mutable_abi_cxx11_(this);
    std::__cxx11::string::string((string *)local_78,(string *)psVar1);
  }
  else {
    local_78 = (string *)operator_new(0x20);
    psVar1 = get_mutable_abi_cxx11_(this);
    std::__cxx11::string::string((string *)local_78,(string *)psVar1);
  }
  get_mutable_abi_cxx11_(this);
  std::__cxx11::string::clear();
  return local_78;
}

Assistant:

std::string* InlinedStringField::Release(Arena* arena, bool donated) {
  // We can not steal donated arena strings.
  std::string* released = (arena != nullptr && donated)
                              ? new std::string(*get_mutable())
                              : new std::string(std::move(*get_mutable()));
  get_mutable()->clear();
  return released;
}